

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isCubeLevelSampleResultValid
               (ConstPixelBufferAccess (*level) [6],Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,CubeFaceFloatCoords *coords,Vec4 *result)

{
  int iVar1;
  ConstPixelBufferAccess (*paCVar2) [6];
  Sampler *sampler_00;
  LookupPrecision *prec_00;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  CubeFaceIntCoords CVar14;
  CubeFaceIntCoords CVar15;
  CubeFaceIntCoords CVar16;
  CubeFaceIntCoords CVar17;
  int j;
  ColorQuad quad;
  Vec2 vBounds;
  Vec2 uBounds;
  float local_14c;
  CubeFace local_138;
  Vec2 local_130;
  float afStack_128 [3];
  int local_11c;
  float local_118;
  TextureChannelClass local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  ulong local_100;
  undefined1 local_f8 [24];
  float afStack_e0 [2];
  float local_d8 [2];
  float afStack_d0 [2];
  float local_c8 [2];
  float afStack_c0 [2];
  CubeFaceFloatCoords *local_b8;
  ConstPixelBufferAccess (*local_b0) [6];
  Sampler *local_a8;
  LookupPrecision *local_a0;
  Vec4 *local_98;
  ulong local_90;
  ulong local_88;
  Vec2 local_80;
  float local_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (filterMode == LINEAR) {
    if (sampler->seamlessCubeMap == true) {
      iVar1 = (*level)[coords->face].m_size.m_data[0];
      local_98 = result;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_70,sampler->normalizedCoords,iVar1,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      local_110 = iVar1;
      local_a8 = sampler;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_78,sampler->normalizedCoords,iVar1,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar6 = floorf(local_70 + -0.5);
      fVar7 = floorf(fStack_6c + -0.5);
      fVar8 = floorf(local_78 + -0.5);
      fVar9 = floorf(fStack_74 + -0.5);
      local_114 = getTextureChannelClass((*level)[coords->face].m_format.type);
      if (local_114 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        local_14c = computeBilinearSearchStepForSnorm(prec);
      }
      else {
        local_14c = 0.0;
        if (local_114 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          local_14c = computeBilinearSearchStepForUnorm(prec);
        }
      }
      local_118 = (float)(int)fVar6;
      local_10c = (int)fVar7;
      fVar6 = (float)(int)fVar8;
      local_11c = (int)fVar9;
      local_b8 = coords;
      local_b0 = level;
      local_a0 = prec;
      while( true ) {
        local_100 = (ulong)(uint)fVar6;
        bVar3 = (int)fVar6 <= local_11c;
        if (local_11c < (int)fVar6) break;
        local_68 = (float)(int)fVar6;
        fVar6 = (float)((int)fVar6 + 1);
        fVar7 = local_118;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        while (iVar1 = local_110, (int)fVar7 <= local_10c) {
          local_f8._4_4_ = fVar7;
          local_f8._0_4_ = coords->face;
          fVar9 = (float)local_100;
          local_f8._8_4_ = fVar9;
          CVar14 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_f8,local_110);
          local_104 = CVar14.t;
          fVar8 = (float)((int)fVar7 + 1);
          local_f8._4_4_ = fVar8;
          local_f8._0_4_ = coords->face;
          local_f8._8_4_ = fVar9;
          CVar15 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_f8,iVar1);
          local_f8._4_4_ = fVar7;
          local_f8._0_4_ = coords->face;
          local_f8._8_4_ = fVar6;
          CVar16 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_f8,iVar1);
          local_f8._4_4_ = fVar8;
          local_f8._0_4_ = coords->face;
          local_f8._8_4_ = fVar6;
          CVar17 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_f8,iVar1);
          local_108 = CVar17.t;
          uVar5 = CVar14._0_8_ & 0xffffffff;
          if (uVar5 == 6) {
            return bVar3;
          }
          local_90 = CVar16._0_8_ & 0xffffffff;
          if (CVar16.face == CUBEFACE_LAST) {
            return bVar3;
          }
          local_138 = CVar15.face;
          if (local_138 == CUBEFACE_LAST) {
            return bVar3;
          }
          local_88 = (ulong)CVar17.face;
          if (CVar17.face == CUBEFACE_LAST) {
            return bVar3;
          }
          local_48 = CONCAT44(fStack_6c,local_70);
          uStack_40 = 0;
          local_58 = CONCAT44(fStack_74,local_78);
          uStack_50 = 0;
          ColorQuad::ColorQuad((ColorQuad *)local_f8);
          sampler_00 = local_a8;
          paCVar2 = local_b0;
          lookup<float>((tcu *)&local_130,*local_b0 + uVar5,local_a8,CVar14.s,local_104,0);
          local_f8._0_4_ = local_130.m_data[0];
          local_f8._4_4_ = local_130.m_data[1];
          local_f8._8_4_ = afStack_128[0];
          local_f8._12_4_ = afStack_128[1];
          lookup<float>((tcu *)&local_130,*paCVar2 + (CVar15._0_8_ & 0xffffffff),sampler_00,CVar15.s
                        ,CVar15.t,0);
          local_d8[0] = local_130.m_data[0];
          local_d8[1] = local_130.m_data[1];
          afStack_d0[0] = afStack_128[0];
          afStack_d0[1] = afStack_128[1];
          lookup<float>((tcu *)&local_130,*paCVar2 + local_90,sampler_00,CVar16.s,CVar16.t,0);
          local_f8._16_4_ = local_130.m_data[0];
          local_f8._20_4_ = local_130.m_data[1];
          afStack_e0[0] = afStack_128[0];
          afStack_e0[1] = afStack_128[1];
          lookup<float>((tcu *)&local_130,*paCVar2 + local_88,sampler_00,CVar17.s,local_108,0);
          prec_00 = local_a0;
          local_c8[0] = local_130.m_data[0];
          local_c8[1] = local_130.m_data[1];
          afStack_c0[0] = afStack_128[0];
          afStack_c0[1] = afStack_128[1];
          if (local_114 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            local_14c = computeBilinearSearchStepFromFloatQuad(local_a0,(ColorQuad *)local_f8);
          }
          fVar7 = (float)(int)fVar7;
          fVar9 = ((float)local_48 + -0.5) - fVar7;
          fVar12 = (local_48._4_4_ + -0.5) - fVar7;
          auVar10._4_4_ = fVar12;
          auVar10._0_4_ = fVar9;
          auVar10._8_4_ = ((float)uStack_40 + 0.0) - fVar7;
          auVar10._12_4_ = (uStack_40._4_4_ + 0.0) - fVar7;
          auVar10 = minps(_DAT_01675880,auVar10);
          fVar7 = ((float)local_58 + -0.5) - local_68;
          fVar13 = (local_58._4_4_ + -0.5) - fStack_64;
          auVar11._4_4_ = fVar13;
          auVar11._0_4_ = fVar7;
          auVar11._8_4_ = ((float)uStack_50 + 0.0) - fStack_60;
          auVar11._12_4_ = (uStack_50._4_4_ + 0.0) - fStack_5c;
          auVar11 = minps(_DAT_01675880,auVar11);
          local_130.m_data[1] = (float)(-(uint)(0.0 <= fVar12) & auVar10._4_4_);
          local_130.m_data[0] = (float)(-(uint)(0.0 <= fVar9) & auVar10._0_4_);
          local_80.m_data[1] = (float)(-(uint)(0.0 <= fVar13) & auVar11._4_4_);
          local_80.m_data[0] = (float)(-(uint)(0.0 <= fVar7) & auVar11._0_4_);
          bVar4 = isBilinearRangeValid
                            (prec_00,(ColorQuad *)local_f8,&local_130,&local_80,local_14c,local_98);
          coords = local_b8;
          fVar7 = fVar8;
          if (bVar4) {
            return bVar3;
          }
        }
      }
    }
    else {
      local_f8._0_4_ = coords->s;
      local_f8._4_4_ = coords->t;
      bVar3 = isLinearSampleResultValid
                        (*level + coords->face,sampler,prec,(Vec2 *)local_f8,0,result);
    }
  }
  else {
    local_f8._0_4_ = coords->s;
    local_f8._4_4_ = coords->t;
    bVar3 = isNearestSampleResultValid<tcu::LookupPrecision,float>
                      (*level + coords->face,sampler,prec,(Vec2 *)local_f8,0,result);
  }
  return bVar3;
}

Assistant:

static bool isCubeLevelSampleResultValid (const ConstPixelBufferAccess		(&level)[CUBEFACE_LAST],
										  const Sampler&					sampler,
										  const Sampler::FilterMode			filterMode,
										  const LookupPrecision&			prec,
										  const CubeFaceFloatCoords&		coords,
										  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearSampleResultValid(level, sampler, prec, coords, result);
		else
			return isLinearSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
	}
	else
		return isNearestSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
}